

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primepalindrome.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  uint __uval;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vector<bool,_std::allocator<bool>_> primes;
  string __str;
  allocator_type local_71;
  vector<bool,_std::allocator<bool>_> local_70;
  string local_48;
  
  local_48._M_dataplus._M_p._0_1_ = 1;
  std::vector<bool,_std::allocator<bool>_>::vector(&local_70,1000,(bool *)&local_48,&local_71);
  lVar1 = (ulong)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
          ((long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
          (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p) * 8;
  auVar12._8_4_ = (int)((ulong)lVar1 >> 0x20);
  auVar12._0_8_ = lVar1;
  auVar12._12_4_ = 0x45300000;
  dVar11 = (auVar12._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
  if (dVar11 < 0.0) {
    dVar11 = sqrt(dVar11);
  }
  else {
    dVar11 = SQRT(dVar11);
  }
  if (2.0 < dVar11) {
    uVar9 = 2;
    do {
      if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
        for (uVar8 = (ulong)(int)((double)(int)uVar9 * (double)(int)uVar9);
            uVar8 < (ulong)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                    ((long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                    (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
            uVar8 = uVar8 + uVar9) {
          uVar10 = uVar8 + 0x3f;
          if (-1 < (long)uVar8) {
            uVar10 = uVar8;
          }
          bVar2 = (byte)uVar8 & 0x3f;
          local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p
          [((long)uVar10 >> 6) + ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)] =
               local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p
               [((long)uVar10 >> 6) +
                ((ulong)((uVar8 & 0x800000000000003f) < 0x8000000000000001) - 1)] &
               (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
        }
      }
      lVar1 = (ulong)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
              ((long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
              (long)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      auVar13._8_4_ = (int)((ulong)lVar1 >> 0x20);
      auVar13._0_8_ = lVar1;
      auVar13._12_4_ = 0x45300000;
      dVar11 = (auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
      if (dVar11 < 0.0) {
        dVar11 = sqrt(dVar11);
      }
      else {
        dVar11 = SQRT(dVar11);
      }
      uVar9 = uVar9 + 1;
    } while ((double)(int)uVar9 < dVar11);
  }
  uVar5 = (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset +
          ((int)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_p -
          (int)local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
               _M_start.super__Bit_iterator_base._M_p) * 8) - 1;
  if (1 < (int)uVar5) {
    uVar9 = (ulong)uVar5;
    do {
      if ((local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) != 0) {
        uVar5 = 1;
        if (9 < uVar9) {
          uVar3 = 4;
          uVar8 = uVar9;
          do {
            uVar5 = uVar3;
            uVar6 = (uint)uVar8;
            if (uVar6 < 100) {
              uVar5 = uVar5 - 2;
              goto LAB_001014ee;
            }
            if (uVar6 < 1000) {
              uVar5 = uVar5 - 1;
              goto LAB_001014ee;
            }
            if (uVar6 < 10000) goto LAB_001014ee;
            uVar8 = (uVar8 & 0xffffffff) / 10000;
            uVar3 = uVar5 + 4;
          } while (99999 < uVar6);
          uVar5 = uVar5 + 1;
        }
LAB_001014ee:
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_48,(char)uVar5);
        std::__detail::__to_chars_10_impl<unsigned_int>(local_48._M_dataplus._M_p,uVar5,(uint)uVar9)
        ;
        bVar4 = isPalindrome(&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
        if (bVar4) {
          plVar7 = (long *)std::ostream::operator<<((ostream *)&std::cout,(uint)uVar9);
          std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
          std::ostream::put((char)plVar7);
          std::ostream::flush();
          break;
        }
      }
      bVar4 = 2 < (long)uVar9;
      uVar9 = uVar9 - 1;
    } while (bVar4);
  }
  if (local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_70.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    vector<bool> primes(1000,true);

    for(int i = 2; i<sqrt(primes.size());i++){
        if(primes[i] == true){
            for(int j = pow(i,2); j < primes.size(); j+=i){
                primes[j] = false;
            }
        }
    }

    for(int i = primes.size()-1; i >= 2; i--){
        if(primes[i]){
            if(isPalindrome(to_string(i))) {
                std::cout << i << std::endl;
                break;
            }
        }
    };
    return 0;
}